

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_add_many(roaring64_bitmap_t *r,size_t n_args,uint64_t *vals)

{
  roaring64_bulk_context_t *in_RDX;
  roaring64_bitmap_t *in_RSI;
  uint64_t *current_val;
  roaring64_bulk_context_t context;
  uint64_t *end;
  roaring64_bulk_context_t *local_38;
  undefined1 local_30 [16];
  roaring64_bulk_context_t *val;
  roaring64_bulk_context_t *context_00;
  
  if (in_RSI != (roaring64_bitmap_t *)0x0) {
    val = (roaring64_bulk_context_t *)(in_RDX->high_bytes + (long)in_RSI * 8);
    local_38 = in_RDX;
    memset(local_30,0,0x10);
    context_00 = local_38;
    for (; local_38 != val; local_38 = (roaring64_bulk_context_t *)&local_38->leaf) {
      roaring64_bitmap_add_bulk(in_RSI,context_00,(uint64_t)val);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add_many(roaring64_bitmap_t *r, size_t n_args,
                               const uint64_t *vals) {
    if (n_args == 0) {
        return;
    }
    const uint64_t *end = vals + n_args;
    roaring64_bulk_context_t context = {0};
    for (const uint64_t *current_val = vals; current_val != end;
         current_val++) {
        roaring64_bitmap_add_bulk(r, &context, *current_val);
    }
}